

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQPOMDP.cpp
# Opt level: O2

void __thiscall
FactoredQLastTimeStepOrQPOMDP::FactoredQLastTimeStepOrQPOMDP
          (FactoredQLastTimeStepOrQPOMDP *this,
          shared_ptr<const_PlanningUnitFactoredDecPOMDPDiscrete> *puf)

{
  int *piVar1;
  sp_counted_base *psVar2;
  QPOMDP *this_00;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> local_38;
  
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface =
       (QFunctionJAOHInterface)&PTR__QFunctionForDecPOMDPInterface_005dac60;
  QFunctionForFactoredDecPOMDPInterface::QFunctionForFactoredDecPOMDPInterface
            ((QFunctionForFactoredDecPOMDPInterface *)
             &(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP,
             &PTR_construction_vtable_152__005da568);
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            (&this->super_FactoredQLastTimeStepOrElse,&PTR_construction_vtable_136__005da4c0,puf);
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface = (QFunctionJAOHInterface)0x5da2f0;
  *(undefined8 *)&(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP =
       0x5da438;
  this_00 = (QPOMDP *)operator_new(0x60);
  local_38.px = &puf->px->super_PlanningUnitDecPOMDPDiscrete;
  local_38.pn.pi_ = (puf->pn).pi_;
  psVar2 = (puf->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  QPOMDP::QPOMDP(this_00,&local_38);
  this->_m_QPOMDP = this_00;
  boost::detail::shared_count::~shared_count(&local_38.pn);
  return;
}

Assistant:

FactoredQLastTimeStepOrQPOMDP::
FactoredQLastTimeStepOrQPOMDP(const boost::shared_ptr<const PlanningUnitFactoredDecPOMDPDiscrete> &puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QPOMDP=new QPOMDP(puf);
}